

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImFont::ImFont(ImFont *this)

{
  (this->IndexLookup).Data = (uint *)0x0;
  (this->Glyphs).Size = 0;
  (this->Glyphs).Capacity = 0;
  this->FallbackAdvanceX = 0.0;
  this->FontSize = 0.0;
  (this->IndexLookup).Size = 0;
  (this->IndexLookup).Capacity = 0;
  (this->IndexAdvanceX).Size = 0;
  (this->IndexAdvanceX).Capacity = 0;
  (this->IndexAdvanceX).Data = (float *)0x0;
  (this->Glyphs).Data = (ImFontGlyph *)0x0;
  this->FallbackChar = 0x3f;
  this->EllipsisChar = 0xffffffff;
  this->DirtyLookupTables = false;
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  *(undefined8 *)((long)&this->ContainerAtlas + 2) = 0;
  *(undefined8 *)((long)&this->ConfigData + 2) = 0;
  this->Scale = 1.0;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  this->MetricsTotalSurface = 0;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  this->Used4kPagesMap[2] = '\0';
  this->Used4kPagesMap[3] = '\0';
  this->Used4kPagesMap[4] = '\0';
  this->Used4kPagesMap[5] = '\0';
  this->Used4kPagesMap[6] = '\0';
  this->Used4kPagesMap[7] = '\0';
  this->Used4kPagesMap[8] = '\0';
  this->Used4kPagesMap[9] = '\0';
  this->Used4kPagesMap[10] = '\0';
  this->Used4kPagesMap[0xb] = '\0';
  this->Used4kPagesMap[0xc] = '\0';
  this->Used4kPagesMap[0xd] = '\0';
  this->Used4kPagesMap[0xe] = '\0';
  this->Used4kPagesMap[0xf] = '\0';
  this->Used4kPagesMap[0x10] = '\0';
  this->Used4kPagesMap[0x11] = '\0';
  this->Used4kPagesMap[0x12] = '\0';
  this->Used4kPagesMap[0x13] = '\0';
  this->Used4kPagesMap[0x12] = '\0';
  this->Used4kPagesMap[0x13] = '\0';
  this->Used4kPagesMap[0x14] = '\0';
  this->Used4kPagesMap[0x15] = '\0';
  this->Used4kPagesMap[0x16] = '\0';
  this->Used4kPagesMap[0x17] = '\0';
  this->Used4kPagesMap[0x18] = '\0';
  this->Used4kPagesMap[0x19] = '\0';
  this->Used4kPagesMap[0x1a] = '\0';
  this->Used4kPagesMap[0x1b] = '\0';
  this->Used4kPagesMap[0x1c] = '\0';
  this->Used4kPagesMap[0x1d] = '\0';
  this->Used4kPagesMap[0x1e] = '\0';
  this->Used4kPagesMap[0x1f] = '\0';
  this->Used4kPagesMap[0x20] = '\0';
  this->Used4kPagesMap[0x21] = '\0';
  return;
}

Assistant:

inline ImVector<T>& operator=(const ImVector<T>& src)   { clear(); resize(src.Size); memcpy(Data, src.Data, (size_t)Size * sizeof(T)); return *this; }